

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InlineCache.h
# Opt level: O1

void Js::InlineCache::OutputPropertyValue<false,_false,_(Js::CacheType)4,_(Js::SlotType)1>::impl
               (InlineCache *cache,Var instance,RecyclableObject *propertyObject,
               PropertyId propertyId,Var *propertyValue,ScriptContext *requestContext)

{
  code *pcVar1;
  bool bVar2;
  undefined4 *puVar3;
  DynamicObject *this;
  Var pvVar4;
  RecyclableObject *function;
  
  if ((undefined1  [24])((undefined1  [24])cache->u & (undefined1  [24])0x2) ==
      (undefined1  [24])0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar3 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/InlineCache.h"
                                ,0x1ac,"(cache->u.accessor.flags & InlineCacheGetterFlag)",
                                "cache->u.accessor.flags & InlineCacheGetterFlag");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar3 = 0;
  }
  if ((undefined1  [24])((undefined1  [24])cache->u & (undefined1  [24])0x8) ==
      (undefined1  [24])0x0) {
    this = UnsafeVarTo<Js::DynamicObject,Js::RecyclableObject>(propertyObject);
  }
  else {
    this = (cache->u).accessor.object;
  }
  pvVar4 = DynamicObject::GetInlineSlot(this,(uint)(cache->u).accessor.slotIndex);
  function = UnsafeVarTo<Js::RecyclableObject>(pvVar4);
  pvVar4 = JavascriptOperators::CallGetter(function,instance,requestContext);
  *propertyValue = pvVar4;
  return;
}

Assistant:

static void impl(
                InlineCache* cache,
                Var const instance,
                RecyclableObject *const propertyObject,
                const PropertyId propertyId,
                Var *const propertyValue,
                ScriptContext *const requestContext)
            {
                Assert(cache->u.accessor.flags & InlineCacheGetterFlag);

                RecyclableObject * function;
                if (cache->u.accessor.isOnProto)
                {
                    function = UnsafeVarTo<RecyclableObject>(cache->GetPropertyValue<slotType>(cache->u.accessor.object, cache->u.accessor.slotIndex));
                }
                else
                {
                    function = UnsafeVarTo<RecyclableObject>(cache->GetPropertyValue<slotType>(UnsafeVarTo<DynamicObject>(propertyObject), cache->u.accessor.slotIndex));
                }

                *propertyValue = JavascriptOperators::CallGetter(function, instance, requestContext);

                // Can't assert because the getter could have a side effect
#ifdef CHKGETTER
                Assert(JavascriptOperators::Equal(*propertyValue, JavascriptOperators::GetProperty(propertyObject, propertyId, requestContext), requestContext));
#endif
            }